

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unewdata.cpp
# Opt level: O3

uint32_t udata_finish(UNewDataMemory *pData,UErrorCode *pErrorCode)

{
  uint32_t uVar1;
  int iVar2;
  
  uVar1 = 0;
  if (((pErrorCode != (UErrorCode *)0x0) && (uVar1 = 0, pData != (UNewDataMemory *)0x0)) &&
     (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR)) {
    if (pData->file == (FileStream *)0x0) {
      uVar1 = 0;
    }
    else {
      uVar1 = T_FileStream_size(pData->file);
      iVar2 = T_FileStream_error(pData->file);
      if (iVar2 == 0) {
        uVar1 = uVar1 - pData->headerSize;
      }
      else {
        *pErrorCode = U_FILE_ACCESS_ERROR;
      }
      T_FileStream_close(pData->file);
    }
    uprv_free_63(pData);
  }
  return uVar1;
}

Assistant:

U_CAPI uint32_t U_EXPORT2
udata_finish(UNewDataMemory *pData, UErrorCode *pErrorCode) {
    uint32_t fileLength=0;

    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        return 0;
    }

    if(pData!=NULL) {
        if(pData->file!=NULL) {
            /* fflush(pData->file);*/
            fileLength=T_FileStream_size(pData->file);
            if(T_FileStream_error(pData->file)) {
                *pErrorCode=U_FILE_ACCESS_ERROR;
            } else {
                fileLength-=pData->headerSize;
            }
            T_FileStream_close(pData->file);
        }
        uprv_free(pData);
    }

    return fileLength;
}